

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O2

void Wlc_NtkExploreMem_rec(Wlc_Ntk_t *p,Wlc_Obj_t *pObj,Vec_Int_t *vCollect,int nFrames)

{
  ushort uVar1;
  int Id;
  Wlc_Obj_t *pObj_00;
  int i;
  
  while( true ) {
    if (-1 < (char)*(ushort *)pObj) {
      return;
    }
    uVar1 = *(ushort *)pObj & 0x3f;
    if ((uVar1 == 1) || (nFrames == 0 && uVar1 == 3)) break;
    if (uVar1 != 3) {
      for (i = 0; i < (int)pObj->nFanins; i = i + 1) {
        Id = Wlc_ObjFaninId(pObj,i);
        pObj_00 = Wlc_NtkObj(p,Id);
        Wlc_NtkExploreMem_rec(p,pObj_00,vCollect,nFrames);
      }
      return;
    }
    pObj = Wlc_ObjFo2Fi(p,pObj);
    nFrames = nFrames + -1;
  }
  Vec_IntPushUnique(vCollect,(int)(((long)pObj - (long)p->pObjs) / 0x18));
  return;
}

Assistant:

void Wlc_NtkExploreMem_rec( Wlc_Ntk_t * p, Wlc_Obj_t * pObj, Vec_Int_t * vCollect, int nFrames )
{
    int k, iFanin;
    if ( pObj->Mark == 0 )
        return;
    if ( Wlc_ObjType(pObj) == WLC_OBJ_PI || (Wlc_ObjType(pObj) == WLC_OBJ_FO && nFrames == 0) )
    {
        Vec_IntPushUnique( vCollect, Wlc_ObjId(p, pObj) );
        return;
    }
    if ( Wlc_ObjType(pObj) == WLC_OBJ_FO )
    {
        Wlc_NtkExploreMem_rec( p, Wlc_ObjFo2Fi(p, pObj), vCollect, nFrames-1 );
        return;
    }
    Wlc_ObjForEachFanin( pObj, iFanin, k )
        Wlc_NtkExploreMem_rec( p, Wlc_NtkObj(p, iFanin), vCollect, nFrames );
}